

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall tchecker::clockbounds::clockbounds_t::clear(clockbounds_t *this)

{
  element_type *peVar1;
  
  global_lu_map_t::clear
            ((this->_global_lu).
             super___shared_ptr<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  peVar1 = (this->_global_m).
           super___shared_ptr<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1->_M != (map_t *)0x0) {
    operator_delete__(peVar1->_M);
  }
  peVar1->_clock_nb = 0;
  peVar1->_M = (map_t *)0x0;
  local_lu_map_t::clear
            ((this->_local_lu).
             super___shared_ptr<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  local_m_map_t::clear
            ((this->_local_m).
             super___shared_ptr<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  return;
}

Assistant:

void clockbounds_t::clear()
{
  _global_lu->clear();
  _global_m->clear();
  _local_lu->clear();
  _local_m->clear();
}